

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O2

_Bool arm_debug_check_watchpoint_arm(CPUState *cs,CPUWatchpoint *wp)

{
  _Bool _Var1;
  int n;
  bool bVar2;
  
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x27e1) & 0x80) == 0) {
    bVar2 = false;
  }
  else {
    _Var1 = arm_generate_debug_exceptions((CPUARMState *)(cs[1].tb_jmp_cache + 0x3ff));
    n = 0;
    bVar2 = false;
    if (_Var1) {
      do {
        bVar2 = n != 0x10;
        if (n == 0x10) {
          return bVar2;
        }
        _Var1 = bp_wp_matches((ARMCPU *)cs,n,true);
        n = n + 1;
      } while (!_Var1);
    }
  }
  return bVar2;
}

Assistant:

static bool check_watchpoints(ARMCPU *cpu)
{
    CPUARMState *env = &cpu->env;
    int n;

    /*
     * If watchpoints are disabled globally or we can't take debug
     * exceptions here then watchpoint firings are ignored.
     */
    if (extract32(env->cp15.mdscr_el1, 15, 1) == 0
        || !arm_generate_debug_exceptions(env)) {
        return false;
    }

    for (n = 0; n < ARRAY_SIZE(env->cpu_watchpoint); n++) {
        if (bp_wp_matches(cpu, n, true)) {
            return true;
        }
    }
    return false;
}